

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O0

void __thiscall pg::MSPMSolver::coverlower(MSPMSolver *this,int node,int k)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  reference pvVar8;
  int *piStack_c8;
  int to_1;
  int *curedge_3;
  bool escapes_1;
  int *piStack_b8;
  int from_1;
  int *curedge_2;
  int n_1;
  int to;
  int *curedge_1;
  bool escapes;
  int *piStack_98;
  int from;
  int *curedge;
  int local_7c;
  undefined1 local_78 [4];
  int n;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  bool banner;
  int pl;
  int pr;
  int k_local;
  int node_local;
  MSPMSolver *this_local;
  
  uVar2 = Solver::priority(&this->super_Solver,node);
  iVar3 = 1 - (uVar2 & 1);
  q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish._M_node.
  _7_1_ = 0;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)local_78);
  local_7c = node;
  do {
    lVar5 = (long)local_7c;
    lVar6 = Solver::nodecount(&this->super_Solver);
    if (lVar6 <= lVar5) {
      do {
        bVar1 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                          ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_78);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          if ((q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
               _M_finish._M_node._7_1_ & 1) != 0) {
            std::ostream::operator<<
                      ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
          }
          std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
                    ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_78);
          return;
        }
        pvVar8 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                           ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_78);
        curedge_2._0_4_ = *pvVar8;
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
                  ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_78);
        for (piStack_b8 = Solver::ins(&this->super_Solver,(value_type)curedge_2); *piStack_b8 != -1;
            piStack_b8 = piStack_b8 + 1) {
          curedge_3._4_4_ = *piStack_b8;
          if (this->cover[curedge_3._4_4_] == 0) {
            iVar4 = Solver::owner(&this->super_Solver,curedge_3._4_4_);
            if (iVar4 != iVar3) {
              curedge_3._3_1_ = 0;
              for (piStack_c8 = Solver::outs(&this->super_Solver,curedge_3._4_4_); *piStack_c8 != -1
                  ; piStack_c8 = piStack_c8 + 1) {
                if (this->cover[*piStack_c8] == 0) {
                  curedge_3._3_1_ = 1;
                  break;
                }
              }
              if ((curedge_3._3_1_ & 1) != 0) goto LAB_00215f77;
            }
            this->cover[curedge_3._4_4_] = k;
            if (1 < (this->super_Solver).trace) {
              poVar7 = std::operator<<((this->super_Solver).logger," ");
              std::ostream::operator<<(poVar7,curedge_3._4_4_);
            }
            std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                      ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_78,
                       (value_type *)((long)&curedge_3 + 4));
          }
LAB_00215f77:
        }
      } while( true );
    }
    if ((this->cover[local_7c] == 0) &&
       (iVar4 = Solver::priority(&this->super_Solver,local_7c), (int)uVar2 < iVar4)) {
      this->cover[local_7c] = k;
      for (piStack_98 = Solver::ins(&this->super_Solver,local_7c); *piStack_98 != -1;
          piStack_98 = piStack_98 + 1) {
        curedge_1._4_4_ = *piStack_98;
        if (this->cover[curedge_1._4_4_] == 0) {
          iVar4 = Solver::owner(&this->super_Solver,curedge_1._4_4_);
          if (iVar4 != iVar3) {
            curedge_1._3_1_ = 0;
            for (_n_1 = Solver::outs(&this->super_Solver,curedge_1._4_4_); *_n_1 != -1;
                _n_1 = _n_1 + 1) {
              curedge_2._4_4_ = *_n_1;
              if (this->cover[curedge_2._4_4_] == 0) {
                curedge_1._3_1_ = 1;
                break;
              }
            }
            if ((curedge_1._3_1_ & 1) != 0) goto LAB_00215d7b;
          }
          this->cover[curedge_1._4_4_] = k;
          if (1 < (this->super_Solver).trace) {
            if ((q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                 _M_finish._M_node._7_1_ & 1) == 0) {
              std::operator<<((this->super_Solver).logger,"\x1b[7;31;1mcovering\x1b[m ");
            }
            q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_node._7_1_ = 1;
            poVar7 = std::operator<<((this->super_Solver).logger," ");
            std::ostream::operator<<(poVar7,curedge_1._4_4_);
          }
          std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                    ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_78,
                     (value_type *)((long)&curedge_1 + 4));
        }
LAB_00215d7b:
      }
    }
    local_7c = local_7c + 1;
  } while( true );
}

Assistant:

void
MSPMSolver::coverlower(int node, int k)
{
    // initialize
    const int pr = priority(node);
    const int pl = 1-(pr&1); // attract for other player

    bool banner = false;

    std::queue<int> q;

    for (int n=node; n<nodecount(); n++) {
        if (cover[n]) continue; // also for "disabled"
        if (priority(n) <= pr) continue; // skip nodes of same priority
        cover[n] = k;
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            if (cover[from]) continue;
            if (owner(from) != pl) {
                bool escapes = false;
                for (auto curedge = outs(from); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (cover[to]) continue;
                    escapes = true;
                    break;
                }
                if (escapes) continue;
            }
            cover[from] = k;
            if (trace >= 2) {
                if (!banner) logger << "\033[7;31;1mcovering\033[m ";
                banner = true;
                logger << " " << from;
            }
            q.push(from);
        }
    }

    while (!q.empty()) {
        int n = q.front();
        q.pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            if (cover[from]) continue;
            if (owner(from) != pl) {
                bool escapes = false;
                for (auto curedge = outs(from); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (cover[to]) continue;
                    escapes = true;
                    break;
                }
                if (escapes) continue;
            }
            cover[from] = k;
            if (trace >= 2) logger << " " << from;
            q.push(from);
        }
    }

    if (banner) logger << std::endl;
}